

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_prefix_coding.h
# Opt level: O1

decoder_tables * __thiscall
lzham::prefix_coding::decoder_tables::operator=(decoder_tables *this,decoder_tables *other)

{
  void *pvVar1;
  uint uVar2;
  uint32 *puVar3;
  uint16 *puVar4;
  
  if (this != other) {
    puVar3 = this->m_lookup;
    if (puVar3 != (uint32 *)0x0) {
      if ((puVar3[-2] ^ puVar3[-1]) == 0xffffffff) {
        lzham_free(puVar3 + -4);
      }
      this->m_lookup = (uint32 *)0x0;
      this->m_cur_lookup_size = 0;
    }
    puVar4 = this->m_sorted_symbol_order;
    if (puVar4 != (uint16 *)0x0) {
      if ((*(uint *)(puVar4 + -4) ^ *(uint *)(puVar4 + -2)) == 0xffffffff) {
        lzham_free(puVar4 + -8);
      }
      this->m_sorted_symbol_order = (uint16 *)0x0;
      this->m_cur_sorted_symbol_order_size = 0;
    }
    memcpy(this,other,0xc0);
    if (other->m_lookup != (uint32 *)0x0) {
      uVar2 = this->m_cur_lookup_size + (uint)(this->m_cur_lookup_size == 0);
      puVar3 = (uint32 *)0x0;
      pvVar1 = lzham_malloc((ulong)uVar2 * 4 + 0x10,(size_t *)0x0);
      if (pvVar1 != (void *)0x0) {
        puVar3 = (uint32 *)((long)pvVar1 + 0x10);
        *(uint *)((long)pvVar1 + 0xc) = uVar2;
        *(uint *)((long)pvVar1 + 8) = ~uVar2;
      }
      this->m_lookup = puVar3;
      memcpy(puVar3,other->m_lookup,(ulong)this->m_cur_lookup_size << 2);
    }
    if (other->m_sorted_symbol_order != (uint16 *)0x0) {
      uVar2 = this->m_cur_sorted_symbol_order_size +
              (uint)(this->m_cur_sorted_symbol_order_size == 0);
      puVar4 = (uint16 *)0x0;
      pvVar1 = lzham_malloc((ulong)uVar2 * 2 + 0x10,(size_t *)0x0);
      if (pvVar1 != (void *)0x0) {
        puVar4 = (uint16 *)((long)pvVar1 + 0x10);
        *(uint *)((long)pvVar1 + 0xc) = uVar2;
        *(uint *)((long)pvVar1 + 8) = ~uVar2;
      }
      this->m_sorted_symbol_order = puVar4;
      memcpy(puVar4,other->m_sorted_symbol_order,(ulong)this->m_cur_sorted_symbol_order_size * 2);
    }
  }
  return this;
}

Assistant:

decoder_tables& operator= (const decoder_tables& other)
         {
            if (this == &other)
               return *this;

            clear();

            memcpy(this, &other, sizeof(*this));

            if (other.m_lookup)
            {
               m_lookup = lzham_new_array<uint32>(m_cur_lookup_size);
               memcpy(m_lookup, other.m_lookup, sizeof(m_lookup[0]) * m_cur_lookup_size);
            }

            if (other.m_sorted_symbol_order)
            {
               m_sorted_symbol_order = lzham_new_array<uint16>(m_cur_sorted_symbol_order_size);
               memcpy(m_sorted_symbol_order, other.m_sorted_symbol_order, sizeof(m_sorted_symbol_order[0]) * m_cur_sorted_symbol_order_size);
            }

            return *this;
         }